

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O0

UChar32 __thiscall
icu_63::UTF16CollationIterator::previousCodePoint(UTF16CollationIterator *this,UErrorCode *param_1)

{
  UChar UVar1;
  UChar *pUVar2;
  UChar lead;
  UChar32 c;
  UErrorCode *param_1_local;
  UTF16CollationIterator *this_local;
  
  if (this->pos == this->start) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    pUVar2 = this->pos;
    this->pos = pUVar2 + -1;
    this_local._4_4_ = (uint)(ushort)pUVar2[-1];
    if ((((this_local._4_4_ & 0xfffffc00) == 0xdc00) && (this->pos != this->start)) &&
       (UVar1 = this->pos[-1], (UVar1 & 0xfc00U) == 0xd800)) {
      this->pos = this->pos + -1;
      this_local._4_4_ = (uint)(ushort)UVar1 * 0x400 + this_local._4_4_ + 0xfca02400;
    }
  }
  return this_local._4_4_;
}

Assistant:

UChar32
UTF16CollationIterator::previousCodePoint(UErrorCode & /*errorCode*/) {
    if(pos == start) {
        return U_SENTINEL;
    }
    UChar32 c = *--pos;
    UChar lead;
    if(U16_IS_TRAIL(c) && pos != start && U16_IS_LEAD(lead = *(pos - 1))) {
        --pos;
        return U16_GET_SUPPLEMENTARY(lead, c);
    } else {
        return c;
    }
}